

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

YieldResult * __thiscall
NEST::NESTcalc::GetYieldNR
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double massNum,vector<double,_std::allocator<double>_> *NRYieldsParam)

{
  double *pdVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  RandomGen *this_00;
  ostream *poVar5;
  runtime_error *this_01;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  Wvalue WVar14;
  YieldResult result;
  double local_d8;
  double local_c8;
  
  bVar3 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  local_c8 = massNum;
  if (bVar3) {
    local_c8 = this->fdetector->molarMass;
  }
  if ((ulong)((long)(NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start) < 0x60) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"ERROR: You need a minimum of 12 nuisance parameters for the mean yields.");
  }
  else {
    if (330.0 < energy) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "\nWARNING: No data out here, you are beyond the AmBe endpoint of about 300 keV.\n"
                 ,0x4f);
    }
    bVar3 = ValidityTests::nearlyEqual(local_c8,0.0,1e-09);
    if (bVar3) {
      this_00 = RandomGen::rndm();
      iVar4 = RandomGen::SelectRanXeAtom(this_00);
    }
    else {
      iVar4 = (int)local_c8;
    }
    dVar6 = this->fdetector->molarMass / (double)iVar4;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    pdVar1 = (NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = *pdVar1;
    dVar7 = pow(energy,pdVar1[1]);
    local_d8 = dVar7 * dVar9 + 0.0;
    if ((this->fdetector->OldW13eV == false) &&
       (bVar3 = ValidityTests::nearlyEqual(54.0,54.0,1e-09), bVar3)) {
      local_d8 = local_d8 * 1.1716263232;
    }
    pdVar2 = (NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = pdVar2[2];
    dVar7 = pow(dfield,pdVar2[3]);
    dVar8 = pow(density / 2.9,0.3);
    dVar8 = dVar8 * dVar7 * dVar9;
    pdVar2 = (NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = pow(pdVar2[4] + energy,pdVar2[9]);
    pdVar2 = (NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = pow(energy / pdVar2[5],pdVar2[6]);
    dVar7 = pow(dVar7 + 1.0,
                (NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[10]);
    dVar9 = (-1.0 / dVar7 + 1.0) * (1.0 / (dVar9 * dVar8));
    if (this->fdetector->OldW13eV == false) {
      dVar9 = dVar9 * 1.08;
    }
    dVar10 = local_d8 / energy - dVar9;
    dVar7 = 0.0;
    if (0.0 <= dVar9) {
      dVar7 = dVar9;
    }
    dVar9 = 0.0;
    if (0.0 <= dVar10) {
      dVar9 = dVar10;
    }
    dVar13 = dVar7 * energy * dVar6;
    pdVar2 = (NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = pow(energy / pdVar2[7],pdVar2[8]);
    dVar7 = pow(dVar7 + 1.0,
                (NRYieldsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[0xb]);
    dVar10 = dVar13 + (-1.0 / dVar7 + 1.0) * dVar9 * energy * dVar6;
    dVar6 = dVar8 * dVar13 * 0.25;
    dVar9 = exp(dVar6);
    dVar9 = (dVar9 + -1.0) * (4.0 / dVar8);
    dVar6 = exp(dVar6);
    dVar6 = ((dVar6 * 4.0 - dVar8 * dVar10) + -4.0) * (-1.0 / dVar8);
    dVar7 = dVar6 / dVar9;
    WVar14 = WorkFunction(density,this->fdetector->molarMass,this->fdetector->OldW13eV);
    uVar11 = WVar14.alpha._0_4_;
    uVar12 = WVar14.alpha._4_4_;
    if (100.0 < energy && dVar7 < WVar14.alpha) {
      dVar9 = dVar10 / (WVar14.alpha + 1.0);
      dVar6 = dVar10 - dVar9;
    }
    else {
      uVar11 = SUB84(dVar7,0);
      uVar12 = (undefined4)((ulong)dVar7 >> 0x20);
    }
    if (energy < 1.0 && 1.0 < (double)CONCAT44(uVar12,uVar11)) {
      dVar9 = dVar10 * 0.5;
      dVar6 = dVar10 - dVar9;
    }
    if ((1.0 <= density) && (dVar6 < 0.0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "\nCAUTION: You are approaching the border of NEST\'s validity for high-energy (OR, for LOW) NR, or are beyond it, at "
                 ,0x73);
      poVar5 = std::ostream::_M_insert<double>(energy);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," keV.",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (ABS((dVar6 + dVar9) - dVar10) <= 2e-06) {
      (*this->_vptr_NESTcalc[0xb])(energy,WVar14.Wq_eV._0_4_,__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"ERROR: Quanta not conserved. Tell Matthew Immediately!");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

YieldResult NESTcalc::GetYieldNR(double energy, double density, double dfield,
                                 double massNum,
                                 const std::vector<double> &NRYieldsParam) {
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))
    massNum = fdetector->get_molarMass();

  if (NRYieldsParam.size() < 12) {
    throw std::runtime_error(
        "ERROR: You need a minimum of 12 nuisance parameters for the mean "
        "yields.");
  }
  if (energy > HIGH_E_NR)
    cerr << "\nWARNING: No data out here, you are beyond the AmBe endpoint of "
            "about 300 keV.\n";
  int massNumber;
  double ScaleFactor[2] = {1., 1.};
  if (ValidityTests::nearlyEqual(massNum, 0.))
    massNumber = RandomGen::rndm()->SelectRanXeAtom();
  else {
    massNumber = int(massNum);
  }
  ScaleFactor[0] = sqrt(fdetector->get_molarMass() / (double)massNumber);
  ScaleFactor[1] = ScaleFactor[0];
  double Nq = NRYieldsParam[0] * pow(energy, NRYieldsParam[1]) + McMConst;
  if (!fdetector->get_OldW13eV() && ValidityTests::nearlyEqual(ATOM_NUM, 54.)) Nq *= ZurichEXOW;
  double ThomasImel = NRYieldsParam[2] * pow(dfield, NRYieldsParam[3]) *
                      pow(density / DENSITY, 0.3);
  double Qy =
      1. / (ThomasImel * pow(energy + NRYieldsParam[4], NRYieldsParam[9]));
  Qy *= 1. - 1. / pow(1. + pow((energy / NRYieldsParam[5]), NRYieldsParam[6]),
                      NRYieldsParam[10]);
  if (!fdetector->get_OldW13eV()) Qy *= ZurichEXOQ;
  double Ly = Nq / energy - Qy;
  if (Qy < 0.0) Qy = 0.0;
  if (Ly < 0.0) Ly = 0.0;
  double Ne = Qy * energy * ScaleFactor[1];
  double Nph =
      Ly * energy * ScaleFactor[0];
  if (McMConst == 0.0) {
  	Nph *= (1. - 1. / pow(1. + pow((energy / NRYieldsParam[7]), NRYieldsParam[8]), NRYieldsParam[11]));
  }
  Nq = Nph + Ne;
  double Ni = (4. / ThomasImel) * (exp(Ne * ThomasImel / 4.) - 1.);
  double Nex = (-1. / ThomasImel) *
               (4. * exp(Ne * ThomasImel / 4.) - (Ne + Nph) * ThomasImel - 4.);

  double NexONi = Nex / Ni;
  Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  if (NexONi < wvalue.alpha && energy > 1e2) {
    NexONi = wvalue.alpha;
    Ni = Nq / (1. + NexONi);
    Nex = Nq - Ni;
  }
  if (NexONi > 1.0 && energy < 1.) {
    NexONi = 1.00;
    Ni = Nq / (1. + NexONi);
    Nex = Nq - Ni;
  }

  if (Nex < 0. && density >= 1.)
    cerr << "\nCAUTION: You are approaching the border of NEST's validity for "
            "high-energy (OR, for LOW) NR, or are beyond it, at "
         << energy << " keV." << endl;
  if (std::abs(Nex + Ni - Nq) > 2. * PHE_MIN) {
    throw std::runtime_error(
        "ERROR: Quanta not conserved. Tell Matthew Immediately!");
  }

  double Wq_eV = wvalue.Wq_eV;
  double L = (Nq / energy) * Wq_eV * 1e-3;

  YieldResult result{};
  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  result.ExcitonRatio = NexONi;
  result.Lindhard = L;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations
}